

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O1

uint __thiscall ThreadContext::GetRedeferralInactiveThreshold(ThreadContext *this)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  
  if ((ulong)this->redeferralState < 3) {
    uVar3 = *(uint *)(&DAT_010bf01c + (ulong)this->redeferralState * 4);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0xaef,"(0)","0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    uVar3 = 0xffffffff;
  }
  return uVar3;
}

Assistant:

uint
ThreadContext::GetRedeferralInactiveThreshold() const
{
    switch(this->redeferralState)
    {
        case InitialRedeferralState:
            return InitialRedeferralDelay;

        case StartupRedeferralState:
            return StartupRedeferralInactiveThreshold;

        case MainRedeferralState:
            return MainRedeferralInactiveThreshold;

        default:
            Assert(0);
            return (uint)-1;
    }
}